

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  undefined4 uVar2;
  uint *puVar3;
  void *pvVar4;
  undefined4 *puVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  float *ptr;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  undefined1 (*pauVar31) [64];
  ulong uVar32;
  undefined1 (*pauVar33) [32];
  undefined1 (*pauVar34) [16];
  int iVar35;
  int iVar36;
  long lVar37;
  undefined1 (*pauVar38) [64];
  ushort uVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  
  iVar24 = bottom_top_blob->elempack;
  iVar30 = bottom_top_blob->dims;
  iVar35 = bottom_top_blob->w;
  uVar29 = bottom_top_blob->h;
  if (iVar30 == 3) {
    uVar25 = bottom_top_blob->c;
    if (0 < (int)uVar25) {
      uVar29 = iVar35 * iVar24 * uVar29;
      uVar32 = 0;
      auVar43 = ZEXT864(0);
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        puVar5 = (undefined4 *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          uVar2 = *puVar5;
          auVar50._4_4_ = uVar2;
          auVar50._0_4_ = uVar2;
          auVar50._8_4_ = uVar2;
          auVar50._12_4_ = uVar2;
          auVar49 = auVar50;
LAB_00320664:
          auVar44 = ZEXT3264(CONCAT1616(auVar50,auVar50));
LAB_0032066a:
          auVar47 = auVar49;
          auVar52 = auVar44._0_32_;
          auVar44 = vinsertf64x4_avx512f(auVar44,auVar52,1);
        }
        else {
          uVar26 = puVar5[uVar32];
          auVar47 = ZEXT416(uVar26);
          if (iVar24 == 4) {
            auVar50 = *(undefined1 (*) [16])(puVar5 + uVar32 * 4);
            auVar49 = ZEXT416(uVar26);
            goto LAB_00320664;
          }
          auVar50._4_4_ = uVar26;
          auVar50._0_4_ = uVar26;
          auVar50._8_4_ = uVar26;
          auVar50._12_4_ = uVar26;
          auVar49 = ZEXT416(uVar26);
          if (iVar24 == 8) {
            auVar44 = ZEXT3264(*(undefined1 (*) [32])(puVar5 + uVar32 * 8));
            goto LAB_0032066a;
          }
          auVar52._4_4_ = uVar26;
          auVar52._0_4_ = uVar26;
          auVar52._8_4_ = uVar26;
          auVar52._12_4_ = uVar26;
          auVar52._16_4_ = uVar26;
          auVar52._20_4_ = uVar26;
          auVar52._24_4_ = uVar26;
          auVar52._28_4_ = uVar26;
          auVar44 = ZEXT3264(auVar52);
          if (iVar24 != 0x10) goto LAB_0032066a;
          auVar44 = *(undefined1 (*) [64])(puVar5 + uVar32 * 0x10);
        }
        pauVar38 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar32 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar26 = 0;
        if (0xf < (int)uVar29) {
          iVar30 = 0xf;
          do {
            auVar45 = vmaxps_avx512f(*pauVar38,auVar43);
            auVar46 = vminps_avx512f(*pauVar38,auVar43);
            auVar45 = vfmadd213ps_avx512f(auVar46,auVar44,auVar45);
            *pauVar38 = auVar45;
            pauVar38 = pauVar38 + 1;
            iVar30 = iVar30 + 0x10;
            uVar26 = uVar29 & 0xfffffff0;
          } while (iVar30 < (int)uVar29);
        }
        uVar28 = uVar26 | 7;
        while ((int)uVar28 < (int)uVar29) {
          auVar51 = vmaxps_avx(*(undefined1 (*) [32])*pauVar38,ZEXT832(0));
          auVar48 = vminps_avx(*(undefined1 (*) [32])*pauVar38,ZEXT832(0));
          auVar49 = vfmadd213ps_fma(auVar48,auVar52,auVar51);
          *(undefined1 (*) [32])*pauVar38 = ZEXT1632(auVar49);
          pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x20);
          uVar28 = uVar26 + 0xf;
          uVar26 = uVar26 + 8;
        }
        uVar28 = uVar26 | 3;
        while ((int)uVar28 < (int)uVar29) {
          auVar49 = vmaxps_avx(*(undefined1 (*) [16])*pauVar38,ZEXT816(0));
          auVar21 = vminps_avx(*(undefined1 (*) [16])*pauVar38,ZEXT816(0));
          auVar49 = vfmadd213ps_fma(auVar21,auVar50,auVar49);
          *(undefined1 (*) [16])*pauVar38 = auVar49;
          pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x10);
          uVar28 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar29) {
          auVar44 = vpbroadcastq_avx512f();
          auVar45 = vbroadcastss_avx512f(auVar47);
          uVar27 = 0;
          do {
            auVar46 = vpbroadcastq_avx512f();
            auVar42 = vporq_avx512f(auVar46,auVar40);
            auVar46 = vporq_avx512f(auVar46,auVar41);
            uVar22 = vpcmpuq_avx512f(auVar46,auVar44,2);
            uVar23 = vpcmpuq_avx512f(auVar42,auVar44,2);
            bVar14 = (byte)uVar23;
            uVar39 = CONCAT11(bVar14,(byte)uVar22);
            piVar1 = (int *)(*pauVar38 + uVar27 * 4);
            auVar46._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
            auVar46._0_4_ = (uint)((byte)uVar22 & 1) * *piVar1;
            auVar46._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
            auVar46._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
            auVar46._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
            auVar46._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
            auVar46._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
            auVar46._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
            auVar46._32_4_ = (uint)(bVar14 & 1) * piVar1[8];
            auVar46._36_4_ = (uint)(bVar14 >> 1 & 1) * piVar1[9];
            auVar46._40_4_ = (uint)(bVar14 >> 2 & 1) * piVar1[10];
            auVar46._44_4_ = (uint)(bVar14 >> 3 & 1) * piVar1[0xb];
            auVar46._48_4_ = (uint)(bVar14 >> 4 & 1) * piVar1[0xc];
            auVar46._52_4_ = (uint)(bVar14 >> 5 & 1) * piVar1[0xd];
            auVar46._56_4_ = (uint)(bVar14 >> 6 & 1) * piVar1[0xe];
            auVar46._60_4_ = (uint)(bVar14 >> 7) * piVar1[0xf];
            uVar22 = vcmpps_avx512f(auVar46,auVar43,1);
            uVar39 = uVar39 & (ushort)uVar22;
            auVar46 = vmulps_avx512f(auVar46,auVar45);
            puVar3 = (uint *)(*pauVar38 + uVar27 * 4);
            bVar6 = (bool)((byte)uVar39 & 1);
            bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar39 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar39 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar39 >> 7) & 1);
            bVar14 = (byte)(uVar39 >> 8);
            bVar15 = (bool)(bVar14 >> 1 & 1);
            bVar16 = (bool)(bVar14 >> 2 & 1);
            bVar17 = (bool)(bVar14 >> 3 & 1);
            bVar18 = (bool)(bVar14 >> 4 & 1);
            bVar19 = (bool)(bVar14 >> 5 & 1);
            bVar20 = (bool)(bVar14 >> 6 & 1);
            *puVar3 = (uint)bVar6 * auVar46._0_4_ | (uint)!bVar6 * *puVar3;
            puVar3[1] = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * puVar3[1];
            puVar3[2] = (uint)bVar8 * auVar46._8_4_ | (uint)!bVar8 * puVar3[2];
            puVar3[3] = (uint)bVar9 * auVar46._12_4_ | (uint)!bVar9 * puVar3[3];
            puVar3[4] = (uint)bVar10 * auVar46._16_4_ | (uint)!bVar10 * puVar3[4];
            puVar3[5] = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * puVar3[5];
            puVar3[6] = (uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * puVar3[6];
            puVar3[7] = (uint)bVar13 * auVar46._28_4_ | (uint)!bVar13 * puVar3[7];
            puVar3[8] = (uint)(bVar14 & 1) * auVar46._32_4_ | (uint)!(bool)(bVar14 & 1) * puVar3[8];
            puVar3[9] = (uint)bVar15 * auVar46._36_4_ | (uint)!bVar15 * puVar3[9];
            puVar3[10] = (uint)bVar16 * auVar46._40_4_ | (uint)!bVar16 * puVar3[10];
            puVar3[0xb] = (uint)bVar17 * auVar46._44_4_ | (uint)!bVar17 * puVar3[0xb];
            puVar3[0xc] = (uint)bVar18 * auVar46._48_4_ | (uint)!bVar18 * puVar3[0xc];
            puVar3[0xd] = (uint)bVar19 * auVar46._52_4_ | (uint)!bVar19 * puVar3[0xd];
            puVar3[0xe] = (uint)bVar20 * auVar46._56_4_ | (uint)!bVar20 * puVar3[0xe];
            puVar3[0xf] = (uint)(bVar14 >> 7) * auVar46._60_4_ |
                          (uint)!(bool)(bVar14 >> 7) * puVar3[0xf];
            uVar27 = uVar27 + 0x10;
          } while (((ulong)(~uVar26 + uVar29) + 0x10 & 0x1fffffff0) != uVar27);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar25);
    }
  }
  else if (iVar30 == 2) {
    if (0 < (int)uVar29) {
      uVar25 = iVar35 * iVar24;
      uVar32 = 0;
      auVar43 = ZEXT864(0);
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        puVar5 = (undefined4 *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          uVar2 = *puVar5;
          auVar49._4_4_ = uVar2;
          auVar49._0_4_ = uVar2;
          auVar49._8_4_ = uVar2;
          auVar49._12_4_ = uVar2;
          auVar50 = auVar49;
LAB_0032047a:
          auVar44 = ZEXT3264(CONCAT1616(auVar49,auVar49));
LAB_00320480:
          auVar47 = auVar50;
          auVar51 = auVar44._0_32_;
          auVar44 = vinsertf64x4_avx512f(auVar44,auVar51,1);
        }
        else {
          uVar26 = puVar5[uVar32];
          auVar47 = ZEXT416(uVar26);
          if (iVar24 == 4) {
            auVar49 = *(undefined1 (*) [16])(puVar5 + uVar32 * 4);
            auVar50 = ZEXT416(uVar26);
            goto LAB_0032047a;
          }
          auVar49._4_4_ = uVar26;
          auVar49._0_4_ = uVar26;
          auVar49._8_4_ = uVar26;
          auVar49._12_4_ = uVar26;
          auVar50 = ZEXT416(uVar26);
          if (iVar24 == 8) {
            auVar44 = ZEXT3264(*(undefined1 (*) [32])(puVar5 + uVar32 * 8));
            goto LAB_00320480;
          }
          auVar51._4_4_ = uVar26;
          auVar51._0_4_ = uVar26;
          auVar51._8_4_ = uVar26;
          auVar51._12_4_ = uVar26;
          auVar51._16_4_ = uVar26;
          auVar51._20_4_ = uVar26;
          auVar51._24_4_ = uVar26;
          auVar51._28_4_ = uVar26;
          auVar44 = ZEXT3264(auVar51);
          if (iVar24 != 0x10) goto LAB_00320480;
          auVar44 = *(undefined1 (*) [64])(puVar5 + uVar32 * 0x10);
        }
        pauVar38 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar32 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar26 = 0;
        if (0xf < (int)uVar25) {
          iVar30 = 0xf;
          do {
            auVar45 = vmaxps_avx512f(*pauVar38,auVar43);
            auVar46 = vminps_avx512f(*pauVar38,auVar43);
            auVar45 = vfmadd213ps_avx512f(auVar46,auVar44,auVar45);
            *pauVar38 = auVar45;
            pauVar38 = pauVar38 + 1;
            iVar30 = iVar30 + 0x10;
            uVar26 = uVar25 & 0xfffffff0;
          } while (iVar30 < (int)uVar25);
        }
        uVar28 = uVar26 | 7;
        while ((int)uVar28 < (int)uVar25) {
          auVar52 = vmaxps_avx(*(undefined1 (*) [32])*pauVar38,ZEXT832(0));
          auVar48 = vminps_avx(*(undefined1 (*) [32])*pauVar38,ZEXT832(0));
          auVar50 = vfmadd213ps_fma(auVar48,auVar51,auVar52);
          *(undefined1 (*) [32])*pauVar38 = ZEXT1632(auVar50);
          pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x20);
          uVar28 = uVar26 + 0xf;
          uVar26 = uVar26 + 8;
        }
        uVar28 = uVar26 | 3;
        while ((int)uVar28 < (int)uVar25) {
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])*pauVar38,ZEXT816(0));
          auVar21 = vminps_avx(*(undefined1 (*) [16])*pauVar38,ZEXT816(0));
          auVar50 = vfmadd213ps_fma(auVar21,auVar49,auVar50);
          *(undefined1 (*) [16])*pauVar38 = auVar50;
          pauVar38 = (undefined1 (*) [64])(*pauVar38 + 0x10);
          uVar28 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar25) {
          auVar44 = vpbroadcastq_avx512f();
          auVar45 = vbroadcastss_avx512f(auVar47);
          uVar27 = 0;
          do {
            auVar46 = vpbroadcastq_avx512f();
            auVar42 = vporq_avx512f(auVar46,auVar40);
            auVar46 = vporq_avx512f(auVar46,auVar41);
            uVar22 = vpcmpuq_avx512f(auVar46,auVar44,2);
            uVar23 = vpcmpuq_avx512f(auVar42,auVar44,2);
            bVar14 = (byte)uVar23;
            uVar39 = CONCAT11(bVar14,(byte)uVar22);
            piVar1 = (int *)(*pauVar38 + uVar27 * 4);
            auVar42._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
            auVar42._0_4_ = (uint)((byte)uVar22 & 1) * *piVar1;
            auVar42._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
            auVar42._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
            auVar42._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
            auVar42._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
            auVar42._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
            auVar42._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
            auVar42._32_4_ = (uint)(bVar14 & 1) * piVar1[8];
            auVar42._36_4_ = (uint)(bVar14 >> 1 & 1) * piVar1[9];
            auVar42._40_4_ = (uint)(bVar14 >> 2 & 1) * piVar1[10];
            auVar42._44_4_ = (uint)(bVar14 >> 3 & 1) * piVar1[0xb];
            auVar42._48_4_ = (uint)(bVar14 >> 4 & 1) * piVar1[0xc];
            auVar42._52_4_ = (uint)(bVar14 >> 5 & 1) * piVar1[0xd];
            auVar42._56_4_ = (uint)(bVar14 >> 6 & 1) * piVar1[0xe];
            auVar42._60_4_ = (uint)(bVar14 >> 7) * piVar1[0xf];
            uVar22 = vcmpps_avx512f(auVar42,auVar43,1);
            uVar39 = uVar39 & (ushort)uVar22;
            auVar46 = vmulps_avx512f(auVar42,auVar45);
            puVar3 = (uint *)(*pauVar38 + uVar27 * 4);
            bVar6 = (bool)((byte)uVar39 & 1);
            bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar39 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar39 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar39 >> 7) & 1);
            bVar14 = (byte)(uVar39 >> 8);
            bVar15 = (bool)(bVar14 >> 1 & 1);
            bVar16 = (bool)(bVar14 >> 2 & 1);
            bVar17 = (bool)(bVar14 >> 3 & 1);
            bVar18 = (bool)(bVar14 >> 4 & 1);
            bVar19 = (bool)(bVar14 >> 5 & 1);
            bVar20 = (bool)(bVar14 >> 6 & 1);
            *puVar3 = (uint)bVar6 * auVar46._0_4_ | (uint)!bVar6 * *puVar3;
            puVar3[1] = (uint)bVar7 * auVar46._4_4_ | (uint)!bVar7 * puVar3[1];
            puVar3[2] = (uint)bVar8 * auVar46._8_4_ | (uint)!bVar8 * puVar3[2];
            puVar3[3] = (uint)bVar9 * auVar46._12_4_ | (uint)!bVar9 * puVar3[3];
            puVar3[4] = (uint)bVar10 * auVar46._16_4_ | (uint)!bVar10 * puVar3[4];
            puVar3[5] = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * puVar3[5];
            puVar3[6] = (uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * puVar3[6];
            puVar3[7] = (uint)bVar13 * auVar46._28_4_ | (uint)!bVar13 * puVar3[7];
            puVar3[8] = (uint)(bVar14 & 1) * auVar46._32_4_ | (uint)!(bool)(bVar14 & 1) * puVar3[8];
            puVar3[9] = (uint)bVar15 * auVar46._36_4_ | (uint)!bVar15 * puVar3[9];
            puVar3[10] = (uint)bVar16 * auVar46._40_4_ | (uint)!bVar16 * puVar3[10];
            puVar3[0xb] = (uint)bVar17 * auVar46._44_4_ | (uint)!bVar17 * puVar3[0xb];
            puVar3[0xc] = (uint)bVar18 * auVar46._48_4_ | (uint)!bVar18 * puVar3[0xc];
            puVar3[0xd] = (uint)bVar19 * auVar46._52_4_ | (uint)!bVar19 * puVar3[0xd];
            puVar3[0xe] = (uint)bVar20 * auVar46._56_4_ | (uint)!bVar20 * puVar3[0xe];
            puVar3[0xf] = (uint)(bVar14 >> 7) * auVar46._60_4_ |
                          (uint)!(bool)(bVar14 >> 7) * puVar3[0xf];
            uVar27 = uVar27 + 0x10;
          } while (((ulong)(~uVar26 + uVar25) + 0x10 & 0x1fffffff0) != uVar27);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar29);
    }
  }
  else if (iVar30 == 1) {
    iVar24 = iVar24 * iVar35;
    pauVar38 = (undefined1 (*) [64])bottom_top_blob->data;
    puVar3 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      uVar29 = *puVar3;
      iVar30 = iVar24 + 0xf;
      if (-1 < iVar24) {
        iVar30 = iVar24;
      }
      uVar25 = iVar30 >> 4;
      if (0xf < iVar24) {
        auVar40 = vbroadcastss_avx512f(ZEXT416(uVar29));
        uVar32 = (ulong)uVar25;
        pauVar31 = pauVar38;
        do {
          auVar41 = vmaxps_avx512f(*pauVar31,ZEXT864(0));
          auVar43 = vminps_avx512f(*pauVar31,ZEXT864(0));
          auVar41 = vfmadd213ps_avx512f(auVar43,auVar40,auVar41);
          *pauVar31 = auVar41;
          pauVar31 = pauVar31 + 1;
          uVar32 = uVar32 - 1;
        } while (uVar32 != 0);
      }
      iVar35 = iVar24 + uVar25 * -0x10;
      iVar30 = iVar35 + 7;
      if (-1 < iVar35) {
        iVar30 = iVar35;
      }
      if (7 < iVar35) {
        auVar48._4_4_ = uVar29;
        auVar48._0_4_ = uVar29;
        auVar48._8_4_ = uVar29;
        auVar48._12_4_ = uVar29;
        auVar48._16_4_ = uVar29;
        auVar48._20_4_ = uVar29;
        auVar48._24_4_ = uVar29;
        auVar48._28_4_ = uVar29;
        uVar32 = (ulong)(uint)(iVar30 >> 3);
        pauVar33 = (undefined1 (*) [32])(*pauVar38 + (long)(int)(uVar25 * 0x10) * 4);
        do {
          auVar52 = vmaxps_avx(*pauVar33,ZEXT1632(ZEXT816(0) << 0x40));
          auVar51 = vminps_avx(*pauVar33,ZEXT1632(ZEXT816(0) << 0x40));
          auVar50 = vfmadd213ps_fma(auVar51,auVar48,auVar52);
          *pauVar33 = ZEXT1632(auVar50);
          pauVar33 = pauVar33 + 1;
          uVar32 = uVar32 - 1;
        } while (uVar32 != 0);
      }
      iVar30 = uVar25 * 0x10 + (iVar30 >> 3) * 8;
      iVar36 = iVar24 - iVar30;
      iVar35 = iVar36 + 3;
      if (-1 < iVar36) {
        iVar35 = iVar36;
      }
      if (3 < iVar36) {
        auVar47._4_4_ = uVar29;
        auVar47._0_4_ = uVar29;
        auVar47._8_4_ = uVar29;
        auVar47._12_4_ = uVar29;
        uVar32 = (ulong)(uint)(iVar35 >> 2);
        pauVar34 = (undefined1 (*) [16])(*pauVar38 + (long)iVar30 * 4);
        do {
          auVar50 = vmaxps_avx(*pauVar34,ZEXT816(0) << 0x40);
          auVar49 = vminps_avx(*pauVar34,ZEXT816(0) << 0x40);
          auVar50 = vfmadd213ps_fma(auVar49,auVar47,auVar50);
          *pauVar34 = auVar50;
          pauVar34 = pauVar34 + 1;
          uVar32 = uVar32 - 1;
        } while (uVar32 != 0);
      }
      iVar30 = iVar30 + (iVar35 >> 2) * 4;
      if (iVar30 < iVar24) {
        lVar37 = (long)iVar30;
        auVar40 = vpbroadcastq_avx512f();
        auVar41 = vbroadcastss_avx512f(ZEXT416(uVar29));
        uVar32 = 0;
        auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar45 = vpbroadcastq_avx512f();
          auVar46 = vporq_avx512f(auVar45,auVar43);
          auVar45 = vporq_avx512f(auVar45,auVar44);
          uVar22 = vpcmpuq_avx512f(auVar45,auVar40,2);
          uVar23 = vpcmpuq_avx512f(auVar46,auVar40,2);
          bVar14 = (byte)uVar23;
          uVar39 = CONCAT11(bVar14,(byte)uVar22);
          piVar1 = (int *)(*pauVar38 + uVar32 * 4 + lVar37 * 4);
          auVar45._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
          auVar45._0_4_ = (uint)((byte)uVar22 & 1) * *piVar1;
          auVar45._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
          auVar45._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
          auVar45._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
          auVar45._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
          auVar45._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
          auVar45._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
          auVar45._32_4_ = (uint)(bVar14 & 1) * piVar1[8];
          auVar45._36_4_ = (uint)(bVar14 >> 1 & 1) * piVar1[9];
          auVar45._40_4_ = (uint)(bVar14 >> 2 & 1) * piVar1[10];
          auVar45._44_4_ = (uint)(bVar14 >> 3 & 1) * piVar1[0xb];
          auVar45._48_4_ = (uint)(bVar14 >> 4 & 1) * piVar1[0xc];
          auVar45._52_4_ = (uint)(bVar14 >> 5 & 1) * piVar1[0xd];
          auVar45._56_4_ = (uint)(bVar14 >> 6 & 1) * piVar1[0xe];
          auVar45._60_4_ = (uint)(bVar14 >> 7) * piVar1[0xf];
          uVar22 = vcmpps_avx512f(auVar45,ZEXT1664(ZEXT816(0) << 0x40),1);
          uVar39 = uVar39 & (ushort)uVar22;
          auVar45 = vmulps_avx512f(auVar45,auVar41);
          puVar3 = (uint *)(*pauVar38 + uVar32 * 4 + lVar37 * 4);
          bVar6 = (bool)((byte)uVar39 & 1);
          bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar39 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar39 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
          bVar13 = (bool)((byte)(uVar39 >> 7) & 1);
          bVar14 = (byte)(uVar39 >> 8);
          bVar15 = (bool)(bVar14 >> 1 & 1);
          bVar16 = (bool)(bVar14 >> 2 & 1);
          bVar17 = (bool)(bVar14 >> 3 & 1);
          bVar18 = (bool)(bVar14 >> 4 & 1);
          bVar19 = (bool)(bVar14 >> 5 & 1);
          bVar20 = (bool)(bVar14 >> 6 & 1);
          *puVar3 = (uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * *puVar3;
          puVar3[1] = (uint)bVar7 * auVar45._4_4_ | (uint)!bVar7 * puVar3[1];
          puVar3[2] = (uint)bVar8 * auVar45._8_4_ | (uint)!bVar8 * puVar3[2];
          puVar3[3] = (uint)bVar9 * auVar45._12_4_ | (uint)!bVar9 * puVar3[3];
          puVar3[4] = (uint)bVar10 * auVar45._16_4_ | (uint)!bVar10 * puVar3[4];
          puVar3[5] = (uint)bVar11 * auVar45._20_4_ | (uint)!bVar11 * puVar3[5];
          puVar3[6] = (uint)bVar12 * auVar45._24_4_ | (uint)!bVar12 * puVar3[6];
          puVar3[7] = (uint)bVar13 * auVar45._28_4_ | (uint)!bVar13 * puVar3[7];
          puVar3[8] = (uint)(bVar14 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar14 & 1) * puVar3[8];
          puVar3[9] = (uint)bVar15 * auVar45._36_4_ | (uint)!bVar15 * puVar3[9];
          puVar3[10] = (uint)bVar16 * auVar45._40_4_ | (uint)!bVar16 * puVar3[10];
          puVar3[0xb] = (uint)bVar17 * auVar45._44_4_ | (uint)!bVar17 * puVar3[0xb];
          puVar3[0xc] = (uint)bVar18 * auVar45._48_4_ | (uint)!bVar18 * puVar3[0xc];
          puVar3[0xd] = (uint)bVar19 * auVar45._52_4_ | (uint)!bVar19 * puVar3[0xd];
          puVar3[0xe] = (uint)bVar20 * auVar45._56_4_ | (uint)!bVar20 * puVar3[0xe];
          puVar3[0xf] = (uint)(bVar14 >> 7) * auVar45._60_4_ |
                        (uint)!(bool)(bVar14 >> 7) * puVar3[0xf];
          uVar32 = uVar32 + 0x10;
        } while (((iVar24 - lVar37) + 0xfU & 0xfffffffffffffff0) != uVar32);
      }
    }
    else {
      iVar30 = iVar24 + 0xf;
      if (-1 < iVar24) {
        iVar30 = iVar24;
      }
      uVar29 = iVar30 >> 4;
      if (0xf < iVar24) {
        uVar32 = (ulong)uVar29;
        lVar37 = 0;
        do {
          auVar40 = vmaxps_avx512f(*(undefined1 (*) [64])(*pauVar38 + lVar37),ZEXT864(0));
          auVar41 = vminps_avx512f(*(undefined1 (*) [64])(*pauVar38 + lVar37),ZEXT864(0));
          auVar40 = vfmadd132ps_avx512f(auVar41,auVar40,
                                        *(undefined1 (*) [64])((long)puVar3 + lVar37));
          *(undefined1 (*) [64])(*pauVar38 + lVar37) = auVar40;
          lVar37 = lVar37 + 0x40;
          uVar32 = uVar32 - 1;
        } while (uVar32 != 0);
      }
      iVar35 = iVar24 + uVar29 * -0x10;
      iVar30 = iVar35 + 7;
      if (-1 < iVar35) {
        iVar30 = iVar35;
      }
      if (7 < iVar35) {
        uVar32 = (ulong)(uint)(iVar30 >> 3);
        lVar37 = (long)(int)(uVar29 * 0x10) << 2;
        do {
          auVar52 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar38 + lVar37),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar51 = vminps_avx(*(undefined1 (*) [32])(*pauVar38 + lVar37),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar50 = vfmadd132ps_fma(auVar51,auVar52,*(undefined1 (*) [32])((long)puVar3 + lVar37));
          *(undefined1 (*) [32])(*pauVar38 + lVar37) = ZEXT1632(auVar50);
          lVar37 = lVar37 + 0x20;
          uVar32 = uVar32 - 1;
        } while (uVar32 != 0);
      }
      iVar30 = uVar29 * 0x10 + (iVar30 >> 3) * 8;
      iVar36 = iVar24 - iVar30;
      iVar35 = iVar36 + 3;
      if (-1 < iVar36) {
        iVar35 = iVar36;
      }
      if (3 < iVar36) {
        uVar32 = (ulong)(uint)(iVar35 >> 2);
        lVar37 = (long)iVar30 << 2;
        do {
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar38 + lVar37),ZEXT816(0) << 0x40);
          auVar49 = vminps_avx(*(undefined1 (*) [16])(*pauVar38 + lVar37),ZEXT816(0) << 0x40);
          auVar50 = vfmadd132ps_fma(auVar49,auVar50,*(undefined1 (*) [16])((long)puVar3 + lVar37));
          *(undefined1 (*) [16])(*pauVar38 + lVar37) = auVar50;
          lVar37 = lVar37 + 0x10;
          uVar32 = uVar32 - 1;
        } while (uVar32 != 0);
      }
      iVar30 = iVar30 + (iVar35 >> 2) * 4;
      if (iVar30 < iVar24) {
        pvVar4 = (this->super_PReLU).slope_data.data;
        lVar37 = (long)iVar30;
        do {
          if (*(float *)(*pauVar38 + lVar37 * 4) < 0.0) {
            *(float *)(*pauVar38 + lVar37 * 4) =
                 *(float *)(*pauVar38 + lVar37 * 4) * *(float *)((long)pvVar4 + lVar37 * 4);
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < iVar24);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}